

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O2

addrinfo * nhr_request_connect_getaddr_info(nhr_request r)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  addrinfo *result;
  addrinfo local_68;
  char portstr [12];
  
  result = (addrinfo *)0x0;
  sprintf(portstr,"%i",(ulong)r->port);
  iVar2 = 4;
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      r->error_code = nhr_error_code_failed_connect_to_host;
      nhr_request_set_command(r,6);
      return (addrinfo *)0x0;
    }
    result = (addrinfo *)0x0;
    local_68.ai_flags = 0;
    local_68.ai_family = 0;
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_socktype = 1;
    local_68.ai_protocol = 0;
    iVar1 = getaddrinfo(r->host,portstr,&local_68,(addrinfo **)&result);
    if (iVar1 == 0 && result != (addrinfo *)0x0) break;
    if (result != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)result);
    }
    nhr_thread_sleep(200);
  }
  return result;
}

Assistant:

struct addrinfo * nhr_request_connect_getaddr_info(nhr_request r) {
	struct addrinfo hints;
	char portstr[12];
	struct addrinfo * result = NULL;
	int ret = 0, retry_number = 0, last_ret = 0;
#if defined(NHR_OS_WINDOWS)
	WSADATA wsa;
	memset(&wsa, 0, sizeof(WSADATA));
	if (WSAStartup(MAKEWORD(2, 2), &wsa) != 0) {
		r->error_code = nhr_error_code_failed_connect_to_host;
		nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
		return NULL;
	}
#endif

	nhr_sprintf(portstr, 12, "%i", r->port);
	while (++retry_number < NHR_CONNECT_ATTEMPS) {
		result = NULL;
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = AF_UNSPEC;
		hints.ai_socktype = SOCK_STREAM;

		ret = getaddrinfo(r->host, portstr, &hints, &result);
		if (ret == 0 && result) {
			return result;
		}

		if (ret != 0) {
			last_ret = ret;
		}
		if (result) {
			freeaddrinfo(result);
		}
		nhr_thread_sleep(NHR_CONNECT_RETRY_DELAY);
	}

#if defined(NHR_OS_WINDOWS)
	WSACleanup();
#endif

	r->error_code = nhr_error_code_failed_connect_to_host;
	nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
	return NULL;
}